

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,PtrOffsetInst *i)

{
  int iVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  int *piVar4;
  VarId *v;
  long in_RSI;
  long in_RDI;
  Reg reg;
  Reg num_reg;
  VarId *var_val;
  int *int_val;
  Value offset_value;
  int item_size;
  PtrTy *ptr_ty_;
  SharedTyPtr *ptr_ty;
  Value *in_stack_fffffffffffffdf8;
  VarId *other;
  Value *in_stack_fffffffffffffe00;
  RegisterOperand *this_00;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *in_stack_fffffffffffffe08;
  unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *__u;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *in_stack_fffffffffffffe10;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *this_01;
  VarId *in_stack_fffffffffffffe18;
  Codegen *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  uint *in_stack_fffffffffffffe50;
  OpCode *in_stack_fffffffffffffe58;
  RegisterOperand *__args_3;
  uint *in_stack_fffffffffffffe68;
  uint *in_stack_fffffffffffffe70;
  OpCode *in_stack_fffffffffffffe78;
  unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> local_160 [2];
  RegisterOperand local_150;
  Reg local_13c;
  VarId local_138;
  Reg local_128;
  undefined4 local_124;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> local_120 [6];
  Reg local_f0;
  undefined4 local_ec;
  undefined4 local_d4;
  uint local_d0 [2];
  RegisterOperand local_c8;
  VarId *local_b8;
  Reg local_8c;
  Reg local_78;
  undefined4 local_74;
  int *local_60;
  undefined8 local_34;
  int local_2c;
  element_type *local_28;
  uint32_t local_1c;
  SharedTyPtr *local_18;
  
  local_1c = mir::inst::VarId::operator_cast_to_unsigned_int((VarId *)(in_RSI + 0x18));
  pmVar2 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)in_stack_fffffffffffffe20,(key_type_conflict *)in_stack_fffffffffffffe18);
  local_18 = &pmVar2->ty;
  local_28 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffe00);
  peVar3 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x212f45);
  iVar1 = (*(peVar3->super_Displayable)._vptr_Displayable[3])();
  local_34 = CONCAT44(extraout_var,iVar1);
  piVar4 = std::optional<int>::value((optional<int> *)in_stack_fffffffffffffe00);
  local_2c = *piVar4;
  mir::inst::Value::Value(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_60 = mir::inst::Value::get_if<int>((Value *)0x212f92);
  if (local_60 == (int *)0x0) {
    local_b8 = mir::inst::Value::get_if<mir::inst::VarId>((Value *)0x213114);
    if (local_b8 != (VarId *)0x0) {
      local_c8._12_4_ = alloc_vgp((Codegen *)0x213138);
      local_c8.reg = alloc_vgp((Codegen *)0x21314c);
      local_d4 = 6;
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,int&>
                ((OpCode *)(in_RDI + 0x18),local_d0,(int *)in_stack_fffffffffffffe48);
      __args_3 = &local_c8;
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                (in_stack_fffffffffffffe10);
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                 in_stack_fffffffffffffe00);
      local_ec = 0xc;
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe00,(VarId *)in_stack_fffffffffffffdf8)
      ;
      local_f0 = translate_var_reg(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      arm::RegisterOperand::RegisterOperand
                ((RegisterOperand *)in_stack_fffffffffffffe00,
                 (Reg)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int&,unsigned_int,arm::RegisterOperand>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 __args_3);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
                (in_stack_fffffffffffffe10,
                 (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffffe08);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                (in_stack_fffffffffffffe10);
      std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffffe00);
      v = (VarId *)(in_RDI + 0x18);
      local_124 = 9;
      other = &local_138;
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe00,other);
      local_128 = translate_var_reg(in_stack_fffffffffffffe20,v);
      this_00 = &local_150;
      mir::inst::VarId::VarId((VarId *)this_00,other);
      local_13c = translate_var_reg(in_stack_fffffffffffffe20,v);
      __u = local_160;
      arm::RegisterOperand::RegisterOperand(this_00,(Reg)((ulong)other >> 0x20));
      this_01 = local_120;
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 __args_3);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>(this_01,__u);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)this_00,(value_type *)other);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr(this_01);
      std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)this_00);
    }
  }
  else {
    *local_60 = *local_60 * local_2c;
    local_74 = 9;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe00,(VarId *)in_stack_fffffffffffffdf8);
    local_78 = translate_var_reg(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe00,(VarId *)in_stack_fffffffffffffdf8);
    local_8c = translate_var_reg(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,int&>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffffe10,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffffe08);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffffe10);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffffe00);
  }
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::PtrOffsetInst& i) {
  auto& ptr_ty = func.variables.at(i.ptr).ty;
  auto ptr_ty_ = static_cast<mir::types::PtrTy*>(&*ptr_ty);
  auto item_size = ptr_ty_->item->size().value();

  auto offset_value = i.offset;
  if (auto int_val = offset_value.get_if<int32_t>()) {
    *int_val *= item_size;
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        *int_val));
  } else if (auto var_val = offset_value.get_if<mir::inst::VarId>()) {
    auto num_reg = alloc_vgp();
    auto reg = alloc_vgp();
    inst.push_back(
        std::make_unique<Arith2Inst>(OpCode::Mov, num_reg, item_size));
    inst.push_back(std::make_unique<Arith3Inst>(OpCode::Mul, reg,
                                                translate_var_reg(*var_val),
                                                RegisterOperand(num_reg)));
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        RegisterOperand(reg)));
  }
}